

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O3

void __thiscall PrintActionsLog::act(PrintActionsLog *this,Restaurant *restaurant)

{
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__x;
  ostream *poVar1;
  pointer ppBVar2;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> res;
  char *local_68;
  long local_60;
  char local_58 [16];
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> local_48;
  
  __x = Restaurant::getActionsLog(restaurant);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::vector(&local_48,__x);
  if (local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppBVar2 = local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      (*(*ppBVar2)->_vptr_BaseAction[1])(&local_68);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 !=
             local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  (this->super_BaseAction).status = COMPLETED;
  if (local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrintActionsLog::act(Restaurant &restaurant)
{
    std::vector<BaseAction*>res = restaurant.getActionsLog();
    for (auto i : res)
    {
        std::cout << i->toString() << "\n" ;
    }
    complete();
}